

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_enc_test.c
# Opt level: O1

MPP_RET test_ctx_init(MpiEncMultiCtxInfo *info)

{
  RK_U32 RVar1;
  RK_U32 RVar2;
  MppCodingType MVar3;
  MpiEncTestArgs *pMVar4;
  char *__s1;
  int iVar5;
  MppFrameFormat MVar6;
  FILE *pFVar7;
  CamSource *pCVar8;
  MppFrameFormat MVar9;
  uint uVar10;
  uint uVar11;
  MPP_RET MVar12;
  bool bVar13;
  
  pMVar4 = info->cmd;
  RVar1 = pMVar4->width;
  (info->ctx).width = RVar1;
  RVar2 = pMVar4->height;
  (info->ctx).height = RVar2;
  uVar10 = RVar1 + 0xf & 0xfffffff0;
  if (pMVar4->hor_stride != 0) {
    uVar10 = pMVar4->hor_stride;
  }
  (info->ctx).hor_stride = uVar10;
  uVar10 = RVar2 + 0xf & 0xfffffff0;
  if (pMVar4->ver_stride != 0) {
    uVar10 = pMVar4->ver_stride;
  }
  (info->ctx).ver_stride = uVar10;
  (info->ctx).fmt = pMVar4->format;
  MVar3 = pMVar4->type;
  (info->ctx).type = MVar3;
  (info->ctx).bps = pMVar4->bps_target;
  (info->ctx).bps_min = pMVar4->bps_min;
  (info->ctx).bps_max = pMVar4->bps_max;
  (info->ctx).rc_mode = pMVar4->rc_mode;
  iVar5 = pMVar4->frame_num;
  (info->ctx).frame_num = iVar5;
  if (MVar3 == MPP_VIDEO_CodingMJPEG && iVar5 == 0) {
    _mpp_log_l(4,"mpi_enc_test","jpege default encode only one frame. Use -n [num] for rc case\n",0)
    ;
    (info->ctx).frame_num = 1;
  }
  (info->ctx).gop_mode = pMVar4->gop_mode;
  (info->ctx).gop_len = pMVar4->gop_len;
  (info->ctx).vi_len = pMVar4->vi_len;
  (info->ctx).fps_in_flex = pMVar4->fps_in_flex;
  (info->ctx).fps_in_den = pMVar4->fps_in_den;
  (info->ctx).fps_in_num = pMVar4->fps_in_num;
  (info->ctx).fps_out_flex = pMVar4->fps_out_flex;
  (info->ctx).fps_out_den = pMVar4->fps_out_den;
  (info->ctx).fps_out_num = pMVar4->fps_out_num;
  (info->ctx).scene_mode = pMVar4->scene_mode;
  (info->ctx).cu_qp_delta_depth = pMVar4->cu_qp_delta_depth;
  (info->ctx).anti_flicker_str = pMVar4->anti_flicker_str;
  (info->ctx).atr_str_i = pMVar4->atr_str_i;
  (info->ctx).atr_str_p = pMVar4->atr_str_p;
  (info->ctx).atl_str = pMVar4->atl_str;
  (info->ctx).sao_str_i = pMVar4->sao_str_i;
  (info->ctx).sao_str_p = pMVar4->sao_str_p;
  MVar3 = pMVar4->type;
  iVar5 = mpp_get_soc_type();
  RVar1 = (info->ctx).hor_stride;
  RVar2 = (info->ctx).ver_stride;
  if (iVar5 == 0x16) {
    iVar5 = (RVar1 + 0x3f >> 1 & 0xffffffe0) * (RVar2 + 0x3f >> 6);
  }
  else {
    bVar13 = MVar3 == MPP_VIDEO_CodingHEVC;
    iVar5 = (RVar2 + (uint)bVar13 * 0x10 + 0xf >> (bVar13 | 4U)) *
            (RVar1 + (uint)!bVar13 * 0x20 + 0x1f >> (6U - bVar13 & 0x1f)) * 0x10;
  }
  (info->ctx).mdinfo_size = (long)iVar5;
  __s1 = pMVar4->file_input;
  if (__s1 != (char *)0x0) {
    iVar5 = strncmp(__s1,"/dev/video",10);
    if (iVar5 == 0) {
      _mpp_log_l(4,"mpi_enc_test","open camera device",0);
      pCVar8 = camera_source_init(pMVar4->file_input,4,(info->ctx).width,(info->ctx).height,
                                  (info->ctx).fmt);
      (info->ctx).cam_ctx = pCVar8;
      _mpp_log_l(4,"mpi_enc_test","new framecap ok",0);
      if ((info->ctx).cam_ctx == (CamSource *)0x0) {
        _mpp_log_l(2,"mpi_enc_test","open %s fail",0,pMVar4->file_input);
      }
    }
    else {
      pFVar7 = fopen(__s1,"rb");
      (info->ctx).fp_input = (FILE *)pFVar7;
      if (pFVar7 == (FILE *)0x0) {
        _mpp_log_l(2,"mpi_enc_test","failed to open input file %s\n",0,pMVar4->file_input);
        _mpp_log_l(2,"mpi_enc_test","create default yuv image for test\n",0);
      }
    }
  }
  MVar12 = MPP_OK;
  if (pMVar4->file_output != (char *)0x0) {
    pFVar7 = fopen(pMVar4->file_output,"w+b");
    (info->ctx).fp_output = (FILE *)pFVar7;
    if (pFVar7 == (FILE *)0x0) {
      _mpp_log_l(2,"mpi_enc_test","failed to open output file %s\n",0,pMVar4->file_output);
      MVar12 = MPP_ERR_OPEN_FILE;
    }
  }
  if (pMVar4->file_slt != (char *)0x0) {
    pFVar7 = fopen(pMVar4->file_slt,"wt");
    (info->ctx).fp_verify = (FILE *)pFVar7;
    if (pFVar7 == (FILE *)0x0) {
      _mpp_log_l(2,"mpi_enc_test","failed to open verify file %s\n",0,pMVar4->file_slt);
    }
  }
  MVar6 = (info->ctx).fmt;
  MVar9 = MVar6 & 0xfffff;
  if (MVar9 - MPP_FMT_RGB565 < 0xe) {
LAB_00106de4:
    uVar11 = (info->ctx).hor_stride + 0x3f & 0xffffffc0;
    uVar10 = (info->ctx).ver_stride + 0x3f & 0x3ffffc0;
  }
  else {
    if (MVar9 < MPP_FMT_YUV440SP) {
      if ((0xf44U >> (MVar6 & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) != 0) {
        uVar11 = (info->ctx).ver_stride + 0x3f & 0x7fffffc0;
        uVar10 = (info->ctx).hor_stride * 2 + 0x7e & 0x3ffff80;
        goto LAB_00106e3a;
      }
      if ((0x11U >> (MVar6 & (MPP_FMT_YUV444P|MPP_FMT_YUV444SP)) & 1) != 0) {
        uVar10 = ((info->ctx).ver_stride + 0x3f & 0xffffffc0) *
                 ((info->ctx).hor_stride + 0x3f & 0x3ffffc0) * 3 >> 1;
        goto LAB_00106e3d;
      }
      if (MVar9 == MPP_FMT_YUV400) goto LAB_00106de4;
    }
    uVar11 = (info->ctx).ver_stride + 0x3f & 0x3fffffc0;
    uVar10 = (info->ctx).hor_stride * 4 + 0xfc & 0x3ffff00;
  }
LAB_00106e3a:
  uVar10 = uVar10 * uVar11;
LAB_00106e3d:
  (info->ctx).frame_size = (ulong)uVar10;
  MVar6 = MVar6 & 0xf00000;
  if (MVar6 != MPP_FMT_YUV420SP) {
    if (MVar6 == 0x100000) {
      MVar6 = (((info->ctx).height + 0xf & 0xffffff0) * ((info->ctx).width + 0xf & 0xfffffff0) >> 4)
              + 0xfff & 0x1ffff000;
    }
    else {
      MVar6 = ((info->ctx).height + 0xf & 0xffffff0) * ((info->ctx).width + 0xf & 0xfffffff0) >> 4;
    }
  }
  (info->ctx).header_size = (ulong)MVar6;
  return MVar12;
}

Assistant:

MPP_RET test_ctx_init(MpiEncMultiCtxInfo *info)
{
    MpiEncTestArgs *cmd = info->cmd;
    MpiEncTestData *p = &info->ctx;
    MPP_RET ret = MPP_OK;

    // get paramter from cmd
    p->width        = cmd->width;
    p->height       = cmd->height;
    p->hor_stride   = (cmd->hor_stride) ? (cmd->hor_stride) :
                      (MPP_ALIGN(cmd->width, 16));
    p->ver_stride   = (cmd->ver_stride) ? (cmd->ver_stride) :
                      (MPP_ALIGN(cmd->height, 16));
    p->fmt          = cmd->format;
    p->type         = cmd->type;
    p->bps          = cmd->bps_target;
    p->bps_min      = cmd->bps_min;
    p->bps_max      = cmd->bps_max;
    p->rc_mode      = cmd->rc_mode;
    p->frame_num    = cmd->frame_num;
    if (cmd->type == MPP_VIDEO_CodingMJPEG && p->frame_num == 0) {
        mpp_log("jpege default encode only one frame. Use -n [num] for rc case\n");
        p->frame_num = 1;
    }
    p->gop_mode     = cmd->gop_mode;
    p->gop_len      = cmd->gop_len;
    p->vi_len       = cmd->vi_len;
    p->fps_in_flex  = cmd->fps_in_flex;
    p->fps_in_den   = cmd->fps_in_den;
    p->fps_in_num   = cmd->fps_in_num;
    p->fps_out_flex = cmd->fps_out_flex;
    p->fps_out_den  = cmd->fps_out_den;
    p->fps_out_num  = cmd->fps_out_num;
    p->scene_mode   = cmd->scene_mode;
    p->cu_qp_delta_depth = cmd->cu_qp_delta_depth;
    p->anti_flicker_str = cmd->anti_flicker_str;
    p->atr_str_i = cmd->atr_str_i;
    p->atr_str_p = cmd->atr_str_p;
    p->atl_str = cmd->atl_str;
    p->sao_str_i = cmd->sao_str_i;
    p->sao_str_p = cmd->sao_str_p;
    p->mdinfo_size  = get_mdinfo_size(p, cmd->type);

    if (cmd->file_input) {
        if (!strncmp(cmd->file_input, "/dev/video", 10)) {
            mpp_log("open camera device");
            p->cam_ctx = camera_source_init(cmd->file_input, 4, p->width, p->height, p->fmt);
            mpp_log("new framecap ok");
            if (p->cam_ctx == NULL)
                mpp_err("open %s fail", cmd->file_input);
        } else {
            p->fp_input = fopen(cmd->file_input, "rb");
            if (NULL == p->fp_input) {
                mpp_err("failed to open input file %s\n", cmd->file_input);
                mpp_err("create default yuv image for test\n");
            }
        }
    }

    if (cmd->file_output) {
        p->fp_output = fopen(cmd->file_output, "w+b");
        if (NULL == p->fp_output) {
            mpp_err("failed to open output file %s\n", cmd->file_output);
            ret = MPP_ERR_OPEN_FILE;
        }
    }

    if (cmd->file_slt) {
        p->fp_verify = fopen(cmd->file_slt, "wt");
        if (!p->fp_verify)
            mpp_err("failed to open verify file %s\n", cmd->file_slt);
    }

    // update resource parameter
    switch (p->fmt & MPP_FRAME_FMT_MASK) {
    case MPP_FMT_YUV420SP:
    case MPP_FMT_YUV420P: {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64) * 3 / 2;
    } break;

    case MPP_FMT_YUV422_YUYV :
    case MPP_FMT_YUV422_YVYU :
    case MPP_FMT_YUV422_UYVY :
    case MPP_FMT_YUV422_VYUY :
    case MPP_FMT_YUV422P :
    case MPP_FMT_YUV422SP : {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64) * 2;
    } break;
    case MPP_FMT_YUV400:
    case MPP_FMT_RGB444 :
    case MPP_FMT_BGR444 :
    case MPP_FMT_RGB555 :
    case MPP_FMT_BGR555 :
    case MPP_FMT_RGB565 :
    case MPP_FMT_BGR565 :
    case MPP_FMT_RGB888 :
    case MPP_FMT_BGR888 :
    case MPP_FMT_RGB101010 :
    case MPP_FMT_BGR101010 :
    case MPP_FMT_ARGB8888 :
    case MPP_FMT_ABGR8888 :
    case MPP_FMT_BGRA8888 :
    case MPP_FMT_RGBA8888 : {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64);
    } break;

    default: {
        p->frame_size = MPP_ALIGN(p->hor_stride, 64) * MPP_ALIGN(p->ver_stride, 64) * 4;
    } break;
    }

    if (MPP_FRAME_FMT_IS_FBC(p->fmt)) {
        if ((p->fmt & MPP_FRAME_FBC_MASK) == MPP_FRAME_FBC_AFBC_V1)
            p->header_size = MPP_ALIGN(MPP_ALIGN(p->width, 16) * MPP_ALIGN(p->height, 16) / 16, SZ_4K);
        else
            p->header_size = MPP_ALIGN(p->width, 16) * MPP_ALIGN(p->height, 16) / 16;
    } else {
        p->header_size = 0;
    }

    return ret;
}